

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int valueFromValueList(sqlite3_value *pVal,sqlite3_value **ppOut,int bNext)

{
  char *pcVar1;
  Mem *pMem;
  char *pcVar2;
  u8 uVar3;
  int iVar4;
  u32 amt;
  ulong uVar5;
  u32 local_6c;
  Mem sMem;
  
  *ppOut = (sqlite3_value *)0x0;
  if (pVal == (sqlite3_value *)0x0) {
    iVar4 = sqlite3MisuseError(0x16508);
    return iVar4;
  }
  if ((pVal->flags & 0x1000) == 0) {
    return 1;
  }
  if (pVal->xDel != sqlite3VdbeValueListFree) {
    return 1;
  }
  pcVar1 = pVal->z;
  if (bNext == 0) {
    iVar4 = sqlite3BtreeFirst(*(BtCursor **)pcVar1,(int *)&sMem);
    if (**(char **)pcVar1 != '\0') {
      return 0x65;
    }
  }
  else {
    iVar4 = sqlite3BtreeNext(*(BtCursor **)pcVar1,(int)ppOut);
  }
  if (iVar4 == 0) {
    sMem.szMalloc = 0;
    sMem.uTemp = 0;
    sMem.zMalloc = (char *)0x0;
    sMem.n = 0;
    sMem.flags = 0;
    sMem.enc = '\0';
    sMem.eSubtype = '\0';
    sMem.db = (sqlite3 *)0x0;
    sMem.u.r = 0.0;
    sMem.z = (char *)0x0;
    sMem.xDel = (_func_void_void_ptr *)0x0;
    amt = sqlite3BtreePayloadSize(*(BtCursor **)pcVar1);
    iVar4 = sqlite3VdbeMemFromBtreeZeroOffset(*(BtCursor **)pcVar1,amt,&sMem);
    pcVar2 = sMem.z;
    if (iVar4 == 0) {
      pMem = *(Mem **)(pcVar1 + 8);
      if (sMem.z[1] < '\0') {
        uVar3 = sqlite3GetVarint32((uchar *)(sMem.z + 1),&local_6c);
        uVar5 = (ulong)(byte)(uVar3 + 1);
      }
      else {
        uVar5 = 2;
        local_6c = (int)sMem.z[1];
      }
      sqlite3VdbeSerialGet((uchar *)(pcVar2 + uVar5),local_6c,pMem);
      pMem->enc = pMem->db->enc;
      if (((pMem->flags & 0x4000) == 0) || (iVar4 = sqlite3VdbeMemMakeWriteable(pMem), iVar4 == 0))
      {
        *ppOut = pMem;
        iVar4 = 0;
      }
      else {
        iVar4 = 7;
      }
    }
    sqlite3VdbeMemRelease(&sMem);
    return iVar4;
  }
  return iVar4;
}

Assistant:

static int valueFromValueList(
  sqlite3_value *pVal,        /* Pointer to the ValueList object */
  sqlite3_value **ppOut,      /* Store the next value from the list here */
  int bNext                   /* 1 for _next(). 0 for _first() */
){
  int rc;
  ValueList *pRhs;

  *ppOut = 0;
  if( pVal==0 ) return SQLITE_MISUSE_BKPT;
  if( (pVal->flags & MEM_Dyn)==0 || pVal->xDel!=sqlite3VdbeValueListFree ){
    return SQLITE_ERROR;
  }else{
    assert( (pVal->flags&(MEM_TypeMask|MEM_Term|MEM_Subtype)) ==
                 (MEM_Null|MEM_Term|MEM_Subtype) );
    assert( pVal->eSubtype=='p' );
    assert( pVal->u.zPType!=0 && strcmp(pVal->u.zPType,"ValueList")==0 );
    pRhs = (ValueList*)pVal->z;
  }
  if( bNext ){
    rc = sqlite3BtreeNext(pRhs->pCsr, 0);
  }else{
    int dummy = 0;
    rc = sqlite3BtreeFirst(pRhs->pCsr, &dummy);
    assert( rc==SQLITE_OK || sqlite3BtreeEof(pRhs->pCsr) );
    if( sqlite3BtreeEof(pRhs->pCsr) ) rc = SQLITE_DONE;
  }
  if( rc==SQLITE_OK ){
    u32 sz;       /* Size of current row in bytes */
    Mem sMem;     /* Raw content of current row */
    memset(&sMem, 0, sizeof(sMem));
    sz = sqlite3BtreePayloadSize(pRhs->pCsr);
    rc = sqlite3VdbeMemFromBtreeZeroOffset(pRhs->pCsr,(int)sz,&sMem);
    if( rc==SQLITE_OK ){
      u8 *zBuf = (u8*)sMem.z;
      u32 iSerial;
      sqlite3_value *pOut = pRhs->pOut;
      int iOff = 1 + getVarint32(&zBuf[1], iSerial);
      sqlite3VdbeSerialGet(&zBuf[iOff], iSerial, pOut);
      pOut->enc = ENC(pOut->db);
      if( (pOut->flags & MEM_Ephem)!=0 && sqlite3VdbeMemMakeWriteable(pOut) ){
        rc = SQLITE_NOMEM;
      }else{
        *ppOut = pOut;
      }
    }
    sqlite3VdbeMemRelease(&sMem);
  }
  return rc;
}